

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O2

int dogfood(monst *mon,obj *obj)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  boolean bVar5;
  long lVar6;
  permonst *ppVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  
  uVar3 = mon->data->mflags1;
  uVar10 = obj->corpsenm;
  bVar5 = is_quest_artifact(obj);
  if ((bVar5 != '\0') || (bVar5 = obj_resists(obj,0,0x5f), bVar5 != '\0')) {
    return ((byte)obj->field_0x4a & 1) * 3 + 4;
  }
  if (obj->oclass == '\x0e') {
    return 6;
  }
  if (obj->oclass != '\a') {
    if (obj->otyp == 0xb4) {
      return 7;
    }
    if (obj->otyp == 0xcb) {
      return 7;
    }
    bVar5 = hates_silver(mon->data);
    if ((bVar5 != '\0') && ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xe0)) {
      return 7;
    }
    ppVar7 = mon->data;
    if ((ppVar7 == mons + 10) && ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) < 0x90)) {
      return 2;
    }
    if ((int)ppVar7->mflags1 < 0) {
      uVar8 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
      if (((ushort)(uVar8 - 0xb) < 7) && (uVar8 == 0xb || ppVar7 != mons + 0xd9)) {
        if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xb0) {
          return *(uint *)&obj->field_0x4a >> 0xb & 2;
        }
        return 2;
      }
    }
    if ((obj->field_0x4a & 1) != 0) {
      return 6;
    }
    if ((byte)(obj->oclass - 0xfU) < 2) {
      return 6;
    }
    return 4;
  }
  sVar2 = obj->otyp;
  if (sVar2 == 0x10e) {
    if (obj->corpsenm - 0xbU < 2) {
      if (uVar10 == 0x144 || (mon->mintrinsics & 0x80) == 0) {
        return 7;
      }
    }
    else if (uVar10 == 0x144) {
      return 7;
    }
    if (uVar10 - 0x145 < 2) {
      return 7;
    }
    ppVar7 = mon->data;
    if (ppVar7 == mons + 0xfd) {
      lVar6 = peek_at_iced_corpse_age(obj);
      if (lVar6 + 0x32 <= (long)(ulong)moves) {
        return 0;
      }
      return 7;
    }
  }
  else {
    ppVar7 = mon->data;
    if (ppVar7 == mons + 0xfd) {
      return 7;
    }
  }
  if ((ppVar7->mlet == '0') || ((ppVar7 == mons + 0x85 | (byte)(ppVar7->mflags2 >> 8) & 1) == 1)) {
    if (sVar2 != 0x10e) {
      return 7;
    }
    iVar4 = obj->corpsenm;
    cVar1 = mons[iVar4].mlet;
    if (cVar1 == '\x02') {
      return 7;
    }
    if (cVar1 == '\n') {
      return 7;
    }
    if (cVar1 == '\x16') {
      return 7;
    }
    if (cVar1 == '\x19') {
      return 7;
    }
    if (cVar1 == '7') {
      if (iVar4 != 0x106) {
        return 7;
      }
    }
    else {
      if (cVar1 == ' ') {
        return 7;
      }
      if (cVar1 == '*') {
        if (iVar4 != 0xd6) {
          return 7;
        }
      }
      else {
        if (cVar1 == '6') {
          return 7;
        }
        if ((cVar1 == '\x1f') && (iVar4 != 0x9e)) {
          return 7;
        }
      }
    }
    if (((mons[iVar4].mflags2 & 2) != 0) && ((mons[iVar4].mflags2 >> 8 & 1) == 0 && cVar1 != '0')) {
      return 7;
    }
    if (obj->oeaten != 0) {
      return 7;
    }
    lVar6 = peek_at_iced_corpse_age(obj);
    if ((long)(ulong)moves <= lVar6 + 5) {
      return 0;
    }
    return 7;
  }
  uVar9 = uVar3 >> 0x1d;
  bVar12 = (byte)(uVar3 >> 0x18);
  bVar11 = bVar12 >> 6;
  bVar12 = bVar12 >> 5;
  if (((bVar12 | bVar11) & 1) == 0) {
    return ((byte)obj->field_0x4a & 1) * 2 + 4;
  }
  if ((mon->mtame == '\0') || ((mon->field_0x63 & 4) != 0)) {
    bVar13 = false;
  }
  else {
    bVar13 = *(int *)&mon[1].minvent != 0;
  }
  switch(sVar2) {
  case 0x10d:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
    uVar10 = (uint)((uVar9 & 1) == 0) * 3;
    break;
  case 0x10e:
    lVar6 = peek_at_iced_corpse_age(obj);
    iVar4 = obj->corpsenm;
    if (((((lVar6 + 0x32 <= (long)(ulong)moves) && (iVar4 != 0xa3)) && (iVar4 != 0x154)) &&
        (mon->data->mlet != ' ')) ||
       ((((mons[iVar4].mflags1 >> 0x1b & 1) != 0 && ((mon->mintrinsics & 0x40) == 0)) ||
        (((mons[iVar4].mflags1 >> 0x1c & 1) != 0 && ((mon->mintrinsics & 0x20) == 0)))))) {
      return 5;
    }
    bVar12 = mons[(int)uVar10].mlet;
    if (((0x20 < (ulong)bVar12) || ((0x102400404U >> ((ulong)bVar12 & 0x3f) & 1) == 0)) &&
       (bVar12 != 0x1f || uVar10 == 0x9e)) {
      if ((bVar12 != 0x36) && (bVar12 != 0x37 || (uVar10 & 0xfffffffd) == 0x104)) goto LAB_00170dd0;
    }
    uVar9 = uVar3 >> 0x1e;
    goto LAB_00170dd0;
  case 0x10f:
    if ((obj->corpsenm - 0xbU < 2) && ((mon->mintrinsics & 0x80) == 0)) {
      return 5;
    }
LAB_00170dd0:
    uVar10 = (uint)((uVar9 & 1) == 0) * 2 + 1;
    break;
  default:
    if (bVar13) {
      uVar10 = 2;
    }
    else {
      if (0x11e < sVar2) {
        bVar11 = bVar12;
      }
      uVar10 = bVar11 & 1 ^ 3;
    }
    break;
  case 0x116:
  case 0x11b:
    uVar9 = 0;
    uVar10 = !bVar13 + 2;
    bVar13 = (uVar3 >> 0x1e & 1) == 0;
    goto LAB_00170d60;
  case 0x11a:
    uVar9 = ((bVar11 & 1) != 0 || bVar13) ^ 3;
    uVar10 = 0;
    bVar13 = ppVar7->mlet == '3';
LAB_00170d60:
    if (!bVar13) {
      uVar10 = uVar9;
    }
    break;
  case 0x11d:
    uVar10 = 7;
    if ((ppVar7->mflags2 & 2) == 0) {
      uVar10 = ((bVar11 & 1) != 0 || bVar13) ^ 3;
    }
    break;
  case 0x129:
    uVar10 = ~ppVar7->mflags1 >> 0x1f | 2;
  }
  return uVar10;
}

Assistant:

int dogfood(struct monst *mon, struct obj *obj)
{
	boolean carni = carnivorous(mon->data);
	boolean herbi = herbivorous(mon->data);
	const struct permonst *fptr = &mons[obj->corpsenm];
	boolean starving;

	if (is_quest_artifact(obj) || obj_resists(obj, 0, 95))
	    return obj->cursed ? TABU : APPORT;

	switch(obj->oclass) {
	case FOOD_CLASS:
	    if (obj->otyp == CORPSE &&
		((touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
		 || is_rider(fptr)))
		    return TABU;

	    /* Ghouls only eat old corpses... yum! */
	    if (mon->data == &mons[PM_GHOUL])
		return (obj->otyp == CORPSE &&
			peek_at_iced_corpse_age(obj) + 50L <= moves) ?
				DOGFOOD : TABU;

	    /* Vampires only "eat" very fresh corpses ... */
	    /* Assume meat -> blood */
	    if (is_vampiric(mon->data)) {
		return (obj->otyp == CORPSE &&
			has_blood(&mons[obj->corpsenm]) && !obj->oeaten &&
			peek_at_iced_corpse_age(obj) + 5 >= moves) ?
		       DOGFOOD : TABU;
	    }

	    if (!carni && !herbi)
		    return obj->cursed ? UNDEF : APPORT;

	    /* a starving pet will eat almost anything */
	    starving = (mon->mtame && !mon->isminion &&
			EDOG(mon)->mhpmax_penalty);

	    switch (obj->otyp) {
		case TRIPE_RATION:
		case MEATBALL:
		case MEAT_RING:
		case MEAT_STICK:
		case HUGE_CHUNK_OF_MEAT:
		    return carni ? DOGFOOD : MANFOOD;
		case EGG:
		    if (touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
			return POISON;
		    return carni ? CADAVER : MANFOOD;
		case CORPSE:
		   if ((peek_at_iced_corpse_age(obj) + 50L <= moves
					    && obj->corpsenm != PM_LIZARD
					    && obj->corpsenm != PM_LICHEN
					    && mon->data->mlet != S_FUNGUS) ||
			(acidic(&mons[obj->corpsenm]) && !resists_acid(mon)) ||
			(poisonous(&mons[obj->corpsenm]) &&
						!resists_poison(mon)))
			return POISON;
		    else if (vegan(fptr))
			return herbi ? CADAVER : MANFOOD;
		    else return carni ? CADAVER : MANFOOD;
		case CLOVE_OF_GARLIC:
		    return (is_undead(mon->data) ? TABU :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		case TIN:
		    return metallivorous(mon->data) ? ACCFOOD : MANFOOD;
		case APPLE:
		case CARROT:
		    return herbi ? DOGFOOD : starving ? ACCFOOD : MANFOOD;
		case BANANA:
		    return ((mon->data->mlet == S_YETI) ? DOGFOOD :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		default:
		    if (starving) return ACCFOOD;
		    return (obj->otyp > SLIME_MOLD ?
			    (carni ? ACCFOOD : MANFOOD) :
			    (herbi ? ACCFOOD : MANFOOD));
	    }
	default:
	    if (obj->otyp == AMULET_OF_STRANGULATION ||
			obj->otyp == RIN_SLOW_DIGESTION)
		return TABU;
	    if (hates_silver(mon->data) &&
		objects[obj->otyp].oc_material == SILVER)
		return TABU;
	    if (mon->data == &mons[PM_GELATINOUS_CUBE] && is_organic(obj))
		return ACCFOOD;
	    if (metallivorous(mon->data) && is_metallic(obj) && (is_rustprone(obj) || mon->data != &mons[PM_RUST_MONSTER])) {
		/* Non-rustproofed ferrous based metals are preferred. */
		return (is_rustprone(obj) && !obj->oerodeproof) ? DOGFOOD : ACCFOOD;
	    }
	    if (!obj->cursed && obj->oclass != BALL_CLASS &&
						obj->oclass != CHAIN_CLASS)
		return APPORT;
	    /* fall into next case */
	case ROCK_CLASS:
	    return UNDEF;
	}
}